

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

size_t ts_subtree__write_to_string
                 (Subtree self,char *string,size_t limit,TSLanguage *language,_Bool is_root,
                 _Bool include_all,TSSymbol alias_symbol,_Bool alias_is_named)

{
  TSSymbol symbol_00;
  Subtree self_00;
  char **string_00;
  byte bVar1;
  TSLanguage *language_00;
  TSLanguage *limit_00;
  _Bool _Var2;
  TSSymbolMetadata TVar3;
  byte bVar4;
  int iVar5;
  uint32_t uVar6;
  char *pcVar7;
  TSSymbol *pTVar8;
  size_t sVar9;
  TSSymbol local_a0;
  byte local_99;
  char ***local_98;
  TSSymbol alias_symbol_1;
  Subtree child;
  uint32_t i;
  uint32_t structural_child_index;
  TSSymbol *alias_sequence;
  char *symbol_name;
  TSSymbol symbol;
  _Bool visible;
  char **writer;
  char *cursor;
  _Bool alias_is_named_local;
  _Bool include_all_local;
  TSLanguage *pTStack_30;
  _Bool is_root_local;
  TSLanguage *language_local;
  size_t limit_local;
  char *string_local;
  Subtree self_local;
  
  cursor._5_1_ = alias_is_named;
  cursor._6_1_ = include_all;
  cursor._7_1_ = is_root;
  pTStack_30 = language;
  language_local = (TSLanguage *)limit;
  limit_local = (size_t)string;
  string_local = (char *)self;
  if (self.ptr == (SubtreeHeapData *)0x0) {
    iVar5 = snprintf(string,limit,"(NULL)");
    return (long)iVar5;
  }
  if (limit == 0) {
    local_98 = (char ***)&limit_local;
  }
  else {
    local_98 = &writer;
  }
  local_99 = 1;
  writer = (char **)string;
  if ((!include_all) && (local_99 = 1, !is_root)) {
    _Var2 = ts_subtree_missing(self);
    local_99 = 1;
    if (!_Var2) {
      _Var2 = ts_subtree_visible((Subtree)string_local);
      if (_Var2) {
        _Var2 = ts_subtree_named((Subtree)string_local);
        local_99 = 1;
        if (_Var2) goto LAB_001351ff;
      }
      local_99 = cursor._5_1_;
    }
  }
LAB_001351ff:
  local_99 = local_99 & 1;
  if ((local_99 != 0) && ((cursor._7_1_ & 1) == 0)) {
    iVar5 = snprintf((char *)*local_98,(size_t)language_local," ");
    writer = (char **)((long)writer + (long)iVar5);
  }
  if (local_99 != 0) {
    _Var2 = ts_subtree_is_error((Subtree)string_local);
    if (((_Var2) && (uVar6 = ts_subtree_child_count((Subtree)string_local), uVar6 == 0)) &&
       (*(int *)(string_local + 0x10) != 0)) {
      iVar5 = snprintf((char *)*local_98,(size_t)language_local,"(UNEXPECTED ");
      writer = (char **)((long)writer + (long)iVar5);
      sVar9 = ts_subtree__write_char_to_string
                        ((char *)*local_98,(size_t)language_local,*(int32_t *)(string_local + 0x30))
      ;
      writer = (char **)(sVar9 + (long)writer);
    }
    else {
      _Var2 = ts_subtree_missing((Subtree)string_local);
      if (_Var2) {
        iVar5 = snprintf((char *)*local_98,(size_t)language_local,"(MISSING");
        writer = (char **)((long)writer + (long)iVar5);
      }
      else {
        if (alias_symbol == 0) {
          local_a0 = ts_subtree_symbol((Subtree)string_local);
        }
        else {
          local_a0 = alias_symbol;
        }
        pcVar7 = ts_language_symbol_name(pTStack_30,local_a0);
        iVar5 = snprintf((char *)*local_98,(size_t)language_local,"(%s",pcVar7);
        writer = (char **)((long)writer + (long)iVar5);
      }
    }
  }
  uVar6 = ts_subtree_child_count((Subtree)string_local);
  if (uVar6 != 0) {
    pTVar8 = ts_language_alias_sequence(pTStack_30,(uint)*(ushort *)(string_local + 0x4c));
    child._4_4_ = 0;
    for (child._0_4_ = 0; (uint)child._0_4_ < *(uint *)(string_local + 0x24);
        child._0_4_ = child._0_4_ + 1) {
      self_00 = *(Subtree *)(*(long *)(string_local + 0x30) + (ulong)(uint)child._0_4_ * 8);
      _Var2 = ts_subtree_extra(self_00);
      limit_00 = language_local;
      language_00 = pTStack_30;
      bVar1 = cursor._6_1_;
      if (_Var2) {
        sVar9 = ts_subtree__write_to_string
                          (self_00,(char *)*local_98,(size_t)language_local,pTStack_30,false,
                           (_Bool)(cursor._6_1_ & 1),0,false);
        writer = (char **)(sVar9 + (long)writer);
      }
      else {
        if (pTVar8 == (TSSymbol *)0x0) {
          symbol_00 = 0;
        }
        else {
          symbol_00 = pTVar8[(uint)child._4_4_];
        }
        string_00 = *local_98;
        if (symbol_00 == 0) {
          bVar4 = 0;
        }
        else {
          TVar3 = ts_language_symbol_metadata(pTStack_30,symbol_00);
          bVar4 = (byte)TVar3 >> 1 & 1;
        }
        sVar9 = ts_subtree__write_to_string
                          (self_00,(char *)string_00,(size_t)limit_00,language_00,false,
                           (_Bool)(bVar1 & 1),symbol_00,bVar4 != 0);
        writer = (char **)(sVar9 + (long)writer);
        child._4_4_ = child._4_4_ + 1;
      }
    }
  }
  if (local_99 != 0) {
    iVar5 = snprintf((char *)*local_98,(size_t)language_local,")");
    writer = (char **)((long)writer + (long)iVar5);
  }
  return (long)writer - limit_local;
}

Assistant:

static size_t ts_subtree__write_to_string(Subtree self, char *string, size_t limit,
                                          const TSLanguage *language, bool is_root,
                                          bool include_all, TSSymbol alias_symbol,
                                          bool alias_is_named) {
  if (!self.ptr) return snprintf(string, limit, "(NULL)");

  char *cursor = string;
  char **writer = (limit > 0) ? &cursor : &string;
  bool visible =
    include_all ||
    is_root ||
    ts_subtree_missing(self) ||
    (ts_subtree_visible(self) && ts_subtree_named(self)) ||
    alias_is_named;

  if (visible && !is_root) {
    cursor += snprintf(*writer, limit, " ");
  }

  if (visible) {
    if (ts_subtree_is_error(self) && ts_subtree_child_count(self) == 0 && self.ptr->size.bytes > 0) {
      cursor += snprintf(*writer, limit, "(UNEXPECTED ");
      cursor += ts_subtree__write_char_to_string(*writer, limit, self.ptr->lookahead_char);
    } else if (ts_subtree_missing(self)) {
      cursor += snprintf(*writer, limit, "(MISSING");
    } else {
      TSSymbol symbol = alias_symbol ? alias_symbol : ts_subtree_symbol(self);
      const char *symbol_name = ts_language_symbol_name(language, symbol);
      cursor += snprintf(*writer, limit, "(%s", symbol_name);
    }
  }

  if (ts_subtree_child_count(self)) {
    const TSSymbol *alias_sequence = ts_language_alias_sequence(language, self.ptr->alias_sequence_id);
    uint32_t structural_child_index = 0;
    for (uint32_t i = 0; i < self.ptr->child_count; i++) {
      Subtree child = self.ptr->children[i];
      if (ts_subtree_extra(child)) {
        cursor += ts_subtree__write_to_string(
          child, *writer, limit,
          language, false, include_all,
          0, false
        );
      } else {
        TSSymbol alias_symbol = alias_sequence ? alias_sequence[structural_child_index] : 0;
        cursor += ts_subtree__write_to_string(
          child, *writer, limit,
          language, false, include_all,
          alias_symbol,
          alias_symbol ? ts_language_symbol_metadata(language, alias_symbol).named : false
        );
        structural_child_index++;
      }
    }
  }

  if (visible) cursor += snprintf(*writer, limit, ")");

  return cursor - string;
}